

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

Vec_Wec_t * Gia_Iso2ManPerform(Gia_Man_t *pGia,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Gia_Iso2Man_t *p_00;
  abctime aVar3;
  Vec_Wec_t *pVVar4;
  abctime clk;
  Gia_Iso2Man_t *p;
  int fVerbose_local;
  Gia_Man_t *pGia_local;
  
  aVar2 = Abc_Clock();
  p_00 = Gia_Iso2ManStart(pGia);
  Gia_Iso2ManPrepare(pGia);
  Gia_Iso2ManPropagate(pGia);
  aVar3 = Abc_Clock();
  Gia_Iso2ManPrint(p_00,aVar3 - aVar2,fVerbose);
  while( true ) {
    iVar1 = Gia_Iso2ManUniqify(p_00);
    if (iVar1 == 0) break;
    aVar3 = Abc_Clock();
    Gia_Iso2ManPrint(p_00,aVar3 - aVar2,fVerbose);
    Gia_Iso2ManPropagate(pGia);
  }
  aVar3 = Abc_Clock();
  Gia_Iso2ManPrint(p_00,aVar3 - aVar2,fVerbose);
  Gia_Iso2ManStop(p_00);
  pVVar4 = Gia_Iso2ManDerivePoClasses(pGia);
  return pVVar4;
}

Assistant:

Vec_Wec_t * Gia_Iso2ManPerform( Gia_Man_t * pGia, int fVerbose )
{
    Gia_Iso2Man_t * p;
    abctime clk = Abc_Clock();
    p = Gia_Iso2ManStart( pGia );
    Gia_Iso2ManPrepare( pGia );
    Gia_Iso2ManPropagate( pGia );
    Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
    while ( Gia_Iso2ManUniqify( p ) )
    {
        Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
        Gia_Iso2ManPropagate( pGia );
    }
    Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
/*
    Gia_Iso2ManUpdate( p, 20 );
    while ( Gia_Iso2ManUniqify( p ) )
    {
        Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
        Gia_Iso2ManPropagate( pGia );
    }
    Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
*/
    Gia_Iso2ManStop( p );
    return Gia_Iso2ManDerivePoClasses( pGia );
}